

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
tracing_layer::zeRTASParallelOperationGetPropertiesExt
          (ze_rtas_parallel_operation_ext_handle_t hParallelOperation,
          ze_rtas_parallel_operation_ext_properties_t *pProperties)

{
  _func_void__ze_rtas_parallel_operation_get_properties_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var1;
  _func__ze_result_t__ze_rtas_parallel_operation_ext_handle_t_ptr__ze_rtas_parallel_operation_ext_properties_t_ptr
  *zeApiPtr;
  char *pcVar2;
  undefined1 *puVar3;
  ulong *puVar4;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_f0;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_d8;
  undefined1 local_c0 [8];
  APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_pfnRTASParallelOperationGetPropertiesExtCb_t epilogue_callback_ptr;
  ze_pfnRTASParallelOperationGetPropertiesExtCb_t prologueCallbackPtr;
  size_t i;
  tracer_array_t *currentTracerArray;
  APITracerCallbackDataImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  ze_rtas_parallel_operation_get_properties_ext_params_t tracerParams;
  ze_pfnRTASParallelOperationGetPropertiesExt_t pfnGetPropertiesExt;
  ze_rtas_parallel_operation_ext_properties_t *pProperties_local;
  ze_rtas_parallel_operation_ext_handle_t hParallelOperation_local;
  
  if (DAT_002da290 ==
      (_func__ze_result_t__ze_rtas_parallel_operation_ext_handle_t_ptr__ze_rtas_parallel_operation_ext_properties_t_ptr
       *)0x0) {
    hParallelOperation_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pfnGetPropertiesExt = (ze_pfnRTASParallelOperationGetPropertiesExt_t)pProperties;
    pProperties_local = (ze_rtas_parallel_operation_ext_properties_t *)hParallelOperation;
    pcVar2 = (char *)tracingInProgress();
    if (*pcVar2 == '\0') {
      puVar3 = (undefined1 *)tracingInProgress();
      *puVar3 = 1;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&pProperties_local;
      APITracerCallbackDataImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
      puVar4 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar4 != (ulong *)0x0) {
        for (prologueCallbackPtr = (ze_pfnRTASParallelOperationGetPropertiesExtCb_t)0x0;
            prologueCallbackPtr < (ze_pfnRTASParallelOperationGetPropertiesExtCb_t)*puVar4;
            prologueCallbackPtr = prologueCallbackPtr + 1) {
          epilogCallback.pUserData =
               *(void **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x60);
          p_Var1 = *(_func_void__ze_rtas_parallel_operation_get_properties_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x6b8);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData,(value_type *)&epilogCallback.pUserData);
          epilogCallback.current_api_callback =
               *(_func_void__ze_rtas_parallel_operation_get_properties_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)(puVar4[1] + 0xcb0 + (long)prologueCallbackPtr * 0xcb8);
          local_c0 = (undefined1  [8])p_Var1;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData.prologCallbacks.
                          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_c0)
          ;
        }
      }
      zeApiPtr = DAT_002da290;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_d8,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_f0,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData.prologCallbacks.
                   super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      hParallelOperation_local._4_4_ =
           APITracerWrapperImp<_ze_result_t(*)(_ze_rtas_parallel_operation_ext_handle_t*,_ze_rtas_parallel_operation_ext_properties_t*),_ze_rtas_parallel_operation_get_properties_ext_params_t*,void(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t*,_ze_result_t,void*,void**)>>>,_ze_rtas_parallel_operation_ext_handle_t*&,_ze_rtas_parallel_operation_ext_properties_t*&>
                     (zeApiPtr,(_ze_rtas_parallel_operation_get_properties_ext_params_t *)
                               &apiCallbackData.epilogCallbacks.
                                super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_func_void__ze_rtas_parallel_operation_get_properties_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                       *)currentTracerArray,&local_d8,&local_f0,
                      (_ze_rtas_parallel_operation_ext_handle_t **)
                      apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_ze_rtas_parallel_operation_ext_properties_t **)&pfnGetPropertiesExt);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_f0);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_d8);
      APITracerCallbackDataImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_rtas_parallel_operation_get_properties_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
    }
    else {
      hParallelOperation_local._4_4_ =
           (*DAT_002da290)((_ze_rtas_parallel_operation_ext_handle_t *)pProperties_local,
                           (_ze_rtas_parallel_operation_ext_properties_t *)pfnGetPropertiesExt);
    }
  }
  return hParallelOperation_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASParallelOperationGetPropertiesExt(
        ze_rtas_parallel_operation_ext_handle_t hParallelOperation, ///< [in] handle of parallel operation object
        ze_rtas_parallel_operation_ext_properties_t* pProperties///< [in,out] query result for parallel operation properties
        )
    {
        auto pfnGetPropertiesExt = context.zeDdiTable.RTASParallelOperation.pfnGetPropertiesExt;

        if( nullptr == pfnGetPropertiesExt)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.RTASParallelOperation.pfnGetPropertiesExt, hParallelOperation, pProperties);

        // capture parameters
        ze_rtas_parallel_operation_get_properties_ext_params_t tracerParams = {
            &hParallelOperation,
            &pProperties
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnRTASParallelOperationGetPropertiesExtCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnRTASParallelOperationGetPropertiesExtCb_t, RTASParallelOperation, pfnGetPropertiesExtCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.RTASParallelOperation.pfnGetPropertiesExt,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phParallelOperation,
                                                  *tracerParams.ppProperties);
    }